

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

bool ON_MakeKnotVectorPeriodic(int order,int cv_count,double *knot)

{
  char *sFormat;
  int line_number;
  long lVar1;
  
  if ((order < 2) || (cv_count < order || knot == (double *)0x0)) {
    sFormat = "ON_MakePeriodicKnotVector(): illegal input";
    line_number = 0x362;
  }
  else if (order == 3) {
    if (3 < (uint)cv_count) {
LAB_004d86c3:
      for (lVar1 = 0; order + -2 != (int)lVar1; lVar1 = lVar1 + 1) {
        knot[(ulong)(uint)cv_count + lVar1] =
             (knot[(ulong)(uint)order + lVar1 + -1] - knot[(ulong)(uint)order + lVar1 + -2]) +
             knot[(ulong)(uint)cv_count + lVar1 + -1];
      }
      for (lVar1 = 0; 2 - order != (int)lVar1; lVar1 = lVar1 + -1) {
        knot[(ulong)(uint)order + lVar1 + -3] =
             (knot[(ulong)(uint)cv_count + lVar1 + -2] - knot[(ulong)(uint)cv_count + lVar1 + -1]) +
             knot[(ulong)(uint)order + lVar1 + -2];
      }
      return true;
    }
    sFormat = "ON_MakePeriodicKnotVector(): illegal input degree=2, cv_count<5";
    line_number = 0x372;
  }
  else if (order == 2) {
    if (3 < (uint)cv_count) {
      return true;
    }
    sFormat = "ON_MakePeriodicKnotVector(): illegal input degree=1, cv_count<4";
    line_number = 0x369;
  }
  else {
    if (order * 2 + -2 <= cv_count) goto LAB_004d86c3;
    sFormat = "ON_MakePeriodicKnotVector(): illegal input degree>=3, cv_count<2*degree";
    line_number = 0x378;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
             ,line_number,"",sFormat);
  return false;
}

Assistant:

bool ON_MakeKnotVectorPeriodic(
          int order,          // order (>=2)
          int cv_count,       // cv count (>= (order>=4) ? 2*(order-1) : 5)
          double* knot        // knot[] array
          )
{
  double *k0, *k1;
  int i;
  
  if ( order < 2 || cv_count < order || !knot ) {
    ON_ERROR("ON_MakePeriodicKnotVector(): illegal input");
    return false;
  }

  switch(order) {
  case 2:
    if ( cv_count < 4 ) {
      ON_ERROR("ON_MakePeriodicKnotVector(): illegal input degree=1, cv_count<4");
      return false;
    }
    else {
      return true;
    }
    break;
  case 3:
    if ( cv_count < 4 ) {
      ON_ERROR("ON_MakePeriodicKnotVector(): illegal input degree=2, cv_count<5");
      return false;
    }
    break;
  default:
    if ( cv_count < 2*order-2 ) {
      ON_ERROR("ON_MakePeriodicKnotVector(): illegal input degree>=3, cv_count<2*degree");
      return false;
    }
    break;
  }

  k0 = knot + order-2;
  k1 = knot + cv_count-1;
  i = order-2;
  while (i--) {
    k1[1] = k0[1]-k0[0]+k1[0];
    k0++; k1++;
  }
  k0 = knot + order-2;
  k1 = knot + cv_count-1;
  i = order-2;
  while (i--) {
    k0[-1] = k1[-1] - k1[0] + k0[0];
    k0--; 
    k1--;
  }
  return true;
}